

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_grammar.cpp
# Opt level: O2

int Omega_h::find_goal_symbol(Grammar *g)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  ostream *poVar6;
  int i;
  int *piVar7;
  pointer pPVar8;
  int s;
  pointer local_68;
  set<int,_std::less<int>,_std::allocator<int>_> nonterminals_in_rhss;
  
  nonterminals_in_rhss._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &nonterminals_in_rhss._M_t._M_impl.super__Rb_tree_header._M_header;
  nonterminals_in_rhss._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nonterminals_in_rhss._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  nonterminals_in_rhss._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = (g->productions).
             super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  nonterminals_in_rhss._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       nonterminals_in_rhss._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pPVar8 = (g->productions).
                super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar8 != local_68; pPVar8 = pPVar8 + 1)
  {
    piVar1 = (pPVar8->rhs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar7 = (pPVar8->rhs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar7 != piVar1; piVar7 = piVar7 + 1) {
      s = *piVar7;
      if (s < 0) {
        fail("assertion %s failed at %s +%d\n","0 <= s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_grammar.cpp"
             ,0x1f);
      }
      bVar3 = is_nonterminal(g,s);
      if (bVar3) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &nonterminals_in_rhss,&s);
      }
    }
  }
  s = g->nterminals;
  i = -1;
  do {
    if (g->nsymbols <= s) {
      if (i != -1) {
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&nonterminals_in_rhss._M_t);
        return i;
      }
      std::operator<<((ostream *)&std::cerr,
                      "ERROR: the root nonterminal is unclear for this grammar\n");
LAB_0029de2e:
      abort();
    }
    sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(&nonterminals_in_rhss,&s);
    iVar2 = i;
    if ((sVar4 == 0) && (iVar2 = s, i != -1)) {
      std::operator<<((ostream *)&std::cerr,"ERROR: there is more than one root nonterminal (");
      pvVar5 = at<std::__cxx11::string>(&g->symbol_names,i);
      poVar6 = std::operator<<((ostream *)&std::cerr,(string *)pvVar5);
      poVar6 = std::operator<<(poVar6," and ");
      pvVar5 = at<std::__cxx11::string>(&g->symbol_names,s);
      poVar6 = std::operator<<(poVar6,(string *)pvVar5);
      std::operator<<(poVar6,") in this grammar\n");
      goto LAB_0029de2e;
    }
    i = iVar2;
    s = s + 1;
  } while( true );
}

Assistant:

int find_goal_symbol(Grammar const& g) {
  std::set<int> nonterminals_in_rhss;
  for (auto& p : g.productions) {
    for (auto s : p.rhs) {
      OMEGA_H_CHECK(0 <= s);
      if (is_nonterminal(g, s)) nonterminals_in_rhss.insert(s);
    }
  }
  int result = -1;
  for (int s = g.nterminals; s < g.nsymbols; ++s)
    if (!nonterminals_in_rhss.count(s)) {
      if (result != -1) {
        std::cerr << "ERROR: there is more than one root nonterminal (";
        std::cerr << at(g.symbol_names, result) << " and "
                  << at(g.symbol_names, s) << ") in this grammar\n";
        abort();
      }
      result = s;
    }
  if (result == -1) {
    std::cerr << "ERROR: the root nonterminal is unclear for this grammar\n";
    abort();
  }
  return result;
}